

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O3

HTTPAPIEX_RESULT
HTTPAPIEX_ExecuteRequest
          (HTTPAPIEX_HANDLE handle,HTTPAPI_REQUEST_TYPE requestType,char *relativePath,
          HTTP_HEADERS_HANDLE requestHttpHeadersHandle,BUFFER_HANDLE requestContent,uint *statusCode
          ,HTTP_HEADERS_HANDLE responseHttpHeadersHandle,BUFFER_HANDLE responseContent)

{
  HTTP_HEADERS_RESULT HVar1;
  int iVar2;
  HTTPAPI_RESULT HVar3;
  BUFFER_HANDLE handle_00;
  HTTP_HEADERS_HANDLE httpHeadersHandle;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  char *hostName;
  HTTP_HANDLE pHVar7;
  undefined8 *puVar8;
  uchar *content;
  LOGGER_LOG p_Var9;
  uint *statusCode_00;
  long lVar10;
  HTTPAPIEX_RESULT HVar11;
  size_t index;
  undefined8 uVar12;
  HTTP_HEADERS_HANDLE local_70;
  BUFFER_HANDLE local_68;
  _Bool st [3];
  
  if (handle == (HTTPAPIEX_HANDLE)0x0) {
    p_Var9 = xlogging_get_log_function();
    if (p_Var9 == (LOGGER_LOG)0x0) {
      return HTTPAPIEX_INVALID_ARG;
    }
    iVar2 = 0x175;
  }
  else {
    if (requestType - HTTPAPI_REQUEST_GET < 6) {
      handle_00 = requestContent;
      if ((requestContent == (BUFFER_HANDLE)0x0) &&
         (handle_00 = BUFFER_new(), handle_00 == (BUFFER_HANDLE)0x0)) {
        p_Var9 = xlogging_get_log_function();
        if (p_Var9 != (LOGGER_LOG)0x0) {
          pcVar5 = "unable to build the request content";
          iVar2 = 0xfd;
          goto LAB_0010650a;
        }
        goto LAB_00106515;
      }
      httpHeadersHandle = requestHttpHeadersHandle;
      if ((requestHttpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) &&
         (httpHeadersHandle = HTTPHeaders_Alloc(), httpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0)) {
        p_Var9 = xlogging_get_log_function();
        if (p_Var9 != (LOGGER_LOG)0x0) {
          (*p_Var9)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpapiex.c"
                    ,"buildRequestHttpHeadersHandle",0x96,1,"unable to HTTPHeaders_Alloc");
        }
LAB_001064d2:
        if (requestContent == (BUFFER_HANDLE)0x0) {
          BUFFER_delete(handle_00);
        }
        p_Var9 = xlogging_get_log_function();
        if (p_Var9 != (LOGGER_LOG)0x0) {
          pcVar5 = "unable to build the request http headers handle";
          iVar2 = 0x109;
LAB_0010650a:
          (*p_Var9)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpapiex.c"
                    ,"buildAllRequests",iVar2,1,pcVar5);
        }
      }
      else {
        _st = 0;
        sVar4 = BUFFER_length(handle_00);
        size_tToString(st,0x16,sVar4);
        pcVar5 = STRING_c_str(handle->hostName);
        HVar1 = HTTPHeaders_ReplaceHeaderNameValuePair(httpHeadersHandle,"Host",pcVar5);
        if ((HVar1 != HTTP_HEADERS_OK) ||
           (HVar1 = HTTPHeaders_ReplaceHeaderNameValuePair(httpHeadersHandle,"Content-Length",st),
           HVar1 != HTTP_HEADERS_OK)) {
          if (requestHttpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
            HTTPHeaders_Free(httpHeadersHandle);
          }
          goto LAB_001064d2;
        }
        pcVar5 = "";
        if (relativePath != (char *)0x0) {
          pcVar5 = relativePath;
        }
        statusCode_00 = &dummyStatusCode;
        if (statusCode != (uint *)0x0) {
          statusCode_00 = statusCode;
        }
        local_70 = responseHttpHeadersHandle;
        if ((responseHttpHeadersHandle != (HTTP_HEADERS_HANDLE)0x0) ||
           (local_70 = HTTPHeaders_Alloc(), local_70 != (HTTP_HEADERS_HANDLE)0x0)) {
          local_68 = responseContent;
          if ((responseContent != (BUFFER_HANDLE)0x0) ||
             (local_68 = BUFFER_new(), local_68 != (BUFFER_HANDLE)0x0)) {
            _st = _st & 0xffffffffff000000;
            uVar6 = (ulong)(uint)handle->k;
            if (handle->k == 0xffffffff) {
              handle->k = 0;
              uVar6 = 0;
            }
            do {
              iVar2 = (int)uVar6;
              if (2 < iVar2) break;
              if (st[iVar2] == false) {
                if (iVar2 == 2) {
                  sVar4 = BUFFER_length(handle_00);
                  content = BUFFER_u_char(handle_00);
                  HVar3 = HTTPAPI_ExecuteRequest
                                    (handle->httpHandle,requestType,pcVar5,httpHeadersHandle,content
                                     ,sVar4,statusCode_00,local_70,local_68);
LAB_001062f5:
                  if (HVar3 == HTTPAPI_OK) goto LAB_001062fe;
                  goto LAB_00106194;
                }
                if (iVar2 == 1) {
                  hostName = STRING_c_str(handle->hostName);
                  pHVar7 = HTTPAPI_CreateConnection(hostName);
                  handle->httpHandle = pHVar7;
                  if (pHVar7 != (HTTP_HANDLE)0x0) {
                    sVar4 = VECTOR_size(handle->savedOptions);
                    if (sVar4 != 0) {
                      index = 0;
                      do {
                        puVar8 = (undefined8 *)VECTOR_element(handle->savedOptions,index);
                        HVar3 = HTTPAPI_SetOption(handle->httpHandle,(char *)*puVar8,
                                                  (void *)puVar8[1]);
                        if ((HVar3 != HTTPAPI_OK) &&
                           (p_Var9 = xlogging_get_log_function(), p_Var9 != (LOGGER_LOG)0x0)) {
                          (*p_Var9)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpapiex.c"
                                    ,"HTTPAPIEX_ExecuteRequest",0x1d8,1,
                                    "HTTPAPI_SetOption failed when called for option %s",*puVar8);
                        }
                        index = index + 1;
                      } while (sVar4 != index);
                    }
                    goto LAB_001062fe;
                  }
                  goto LAB_00106194;
                }
                if (iVar2 != 0) goto LAB_00106194;
                if (useGlobalInitialization < 1) {
                  HVar3 = HTTPAPI_Init();
                  goto LAB_001062f5;
                }
LAB_001062fe:
                lVar10 = (long)handle->k;
                if (lVar10 == 2) {
                  HVar11 = HTTPAPIEX_OK;
                  goto LAB_0010635e;
                }
                st[lVar10] = true;
                uVar6 = lVar10 + 1;
                handle->k = (int)uVar6;
                st[lVar10 + 1] = false;
              }
              else {
LAB_00106194:
                iVar2 = handle->k;
                uVar6 = (ulong)(iVar2 - 1U);
                st[iVar2] = false;
                handle->k = iVar2 - 1U;
                if ((long)iVar2 == 2) {
                  HTTPAPI_CloseConnection(handle->httpHandle);
                  handle->httpHandle = (HTTP_HANDLE)0x0;
                }
                else {
                  if ((iVar2 != 1) || (uVar6 = 0, useGlobalInitialization != 0)) goto LAB_0010631d;
                  HTTPAPI_Deinit();
                }
                uVar6 = (ulong)(uint)handle->k;
              }
LAB_0010631d:
            } while (-1 < (int)uVar6);
            p_Var9 = xlogging_get_log_function();
            HVar11 = HTTPAPIEX_RECOVERYFAILED;
            if (p_Var9 != (LOGGER_LOG)0x0) {
              (*p_Var9)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpapiex.c"
                        ,"HTTPAPIEX_ExecuteRequest",0x227,1,
                        "unable to recover sending to a working state");
            }
LAB_0010635e:
            if (requestContent == (BUFFER_HANDLE)0x0) {
              BUFFER_delete(handle_00);
            }
            if (requestHttpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
              HTTPHeaders_Free(httpHeadersHandle);
            }
            if (responseContent == (BUFFER_HANDLE)0x0) {
              BUFFER_delete(local_68);
            }
            if (responseHttpHeadersHandle != (HTTP_HEADERS_HANDLE)0x0) {
              return HVar11;
            }
            HTTPHeaders_Free(local_70);
            return HVar11;
          }
          if (requestContent == (BUFFER_HANDLE)0x0) {
            BUFFER_delete(handle_00);
          }
          if (requestHttpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
            HTTPHeaders_Free(httpHeadersHandle);
          }
          if (responseHttpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
            HTTPHeaders_Free(local_70);
          }
          p_Var9 = xlogging_get_log_function();
          if (p_Var9 == (LOGGER_LOG)0x0) goto LAB_00106515;
          pcVar5 = "unable to build response content";
          iVar2 = 0x14a;
          goto LAB_0010650a;
        }
        if (requestContent == (BUFFER_HANDLE)0x0) {
          BUFFER_delete(handle_00);
        }
        if (requestHttpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
          HTTPHeaders_Free(httpHeadersHandle);
        }
        p_Var9 = xlogging_get_log_function();
        if (p_Var9 != (LOGGER_LOG)0x0) {
          pcVar5 = "unable to build response content";
          iVar2 = 0x131;
          goto LAB_0010650a;
        }
      }
LAB_00106515:
      p_Var9 = xlogging_get_log_function();
      HVar11 = HTTPAPIEX_ERROR;
      if (p_Var9 == (LOGGER_LOG)0x0) {
        return HTTPAPIEX_ERROR;
      }
      iVar2 = 0x194;
      uVar12 = 2;
      pcVar5 = HTTPAPIEX_RESULTStringStorage[2];
      goto LAB_00106563;
    }
    p_Var9 = xlogging_get_log_function();
    if (p_Var9 == (LOGGER_LOG)0x0) {
      return HTTPAPIEX_INVALID_ARG;
    }
    iVar2 = 0x17d;
  }
  HVar11 = HTTPAPIEX_INVALID_ARG;
  uVar12 = 3;
  pcVar5 = HTTPAPIEX_RESULTStringStorage[3];
LAB_00106563:
  (*p_Var9)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpapiex.c"
            ,"HTTPAPIEX_ExecuteRequest",iVar2,1,"error code = %s%s (%d)","",pcVar5,uVar12);
  return HVar11;
}

Assistant:

HTTPAPIEX_RESULT HTTPAPIEX_ExecuteRequest(HTTPAPIEX_HANDLE handle, HTTPAPI_REQUEST_TYPE requestType, const char* relativePath,
    HTTP_HEADERS_HANDLE requestHttpHeadersHandle, BUFFER_HANDLE requestContent, unsigned int* statusCode,
    HTTP_HEADERS_HANDLE responseHttpHeadersHandle, BUFFER_HANDLE responseContent)
{
    HTTPAPIEX_RESULT result;
    /*Codes_SRS_HTTPAPIEX_02_006: [If parameter handle is NULL then HTTPAPIEX_ExecuteRequest shall fail and return HTTPAPIEX_INVALID_ARG.]*/
    if (handle == NULL)
    {
        result = HTTPAPIEX_INVALID_ARG;
        LOG_HTTAPIEX_ERROR();
    }
    else
    {
        /*Codes_SRS_HTTPAPIEX_02_007: [If parameter requestType does not indicate a valid request, HTTPAPIEX_ExecuteRequest shall fail and return HTTPAPIEX_INVALID_ARG.] */
        if (!validRequestType(requestType))
        {
            result = HTTPAPIEX_INVALID_ARG;
            LOG_HTTAPIEX_ERROR();
        }
        else
        {
            HTTPAPIEX_HANDLE_DATA *handleData = (HTTPAPIEX_HANDLE_DATA *)handle;

            /*call to buildAll*/
            const char* toBeUsedRelativePath;
            HTTP_HEADERS_HANDLE toBeUsedRequestHttpHeadersHandle; bool isOriginalRequestHttpHeadersHandle;
            BUFFER_HANDLE toBeUsedRequestContent; bool isOriginalRequestContent;
            unsigned int* toBeUsedStatusCode;
            HTTP_HEADERS_HANDLE toBeUsedResponseHttpHeadersHandle; bool isOriginalResponseHttpHeadersHandle;
            BUFFER_HANDLE toBeUsedResponseContent;  bool isOriginalResponseContent;

            if (buildAllRequests(handleData, requestType, relativePath, requestHttpHeadersHandle, requestContent, statusCode, responseHttpHeadersHandle, responseContent,
                &toBeUsedRelativePath,
                &toBeUsedRequestHttpHeadersHandle, &isOriginalRequestHttpHeadersHandle,
                &toBeUsedRequestContent, &isOriginalRequestContent,
                &toBeUsedStatusCode,
                &toBeUsedResponseHttpHeadersHandle, &isOriginalResponseHttpHeadersHandle,
                &toBeUsedResponseContent, &isOriginalResponseContent) != 0)
            {
                result = HTTPAPIEX_ERROR;
                LOG_HTTAPIEX_ERROR();
            }
            else
            {

                /*Codes_SRS_HTTPAPIEX_02_023: [HTTPAPIEX_ExecuteRequest shall try to execute the HTTP call by ensuring the following API call sequence is respected:]*/
                /*Codes_SRS_HTTPAPIEX_02_024: [If any point in the sequence fails, HTTPAPIEX_ExecuteRequest shall attempt to recover by going back to the previous step and retrying that step.]*/
                /*Codes_SRS_HTTPAPIEX_02_025: [If the first step fails, then the sequence fails.]*/
                /*Codes_SRS_HTTPAPIEX_02_026: [A step shall be retried at most once.]*/
                /*Codes_SRS_HTTPAPIEX_02_027: [If a step has been retried then all subsequent steps shall be retried too.]*/
                bool st[3] = { false, false, false }; /*the three levels of possible failure in resilient send: HTTAPI_Init, HTTPAPI_CreateConnection, HTTPAPI_ExecuteRequest*/
                if (handleData->k == -1)
                {
                    handleData->k = 0;
                }

                do
                {
                    bool goOn;

                    if (handleData->k > 2)
                    {
                        /* error */
                        break;
                    }

                    if (st[handleData->k] == true) /*already been tried*/
                    {
                        goOn = false;
                    }
                    else
                    {
                        switch (handleData->k)
                        {
                        case 0:
                        {
                            if (useGlobalInitialization > 0)
                            {
                                /*Codes_SRS_HTTPAPIEX_21_048: [If HTTPAPIEX_Init was called, HTTPAPI_ExecuteRequest shall not call HTTPAPI_Init.] */
                                goOn = true;
                            }
                            else if (HTTPAPI_Init() != HTTPAPI_OK)
                            {
                                goOn = false;
                            }
                            else
                            {
                                goOn = true;
                            }
                            break;
                        }
                        case 1:
                        {
                            if ((handleData->httpHandle = HTTPAPI_CreateConnection(STRING_c_str(handleData->hostName))) == NULL)
                            {
                                goOn = false;
                            }
                            else
                            {
                                size_t i;
                                size_t vectorSize = VECTOR_size(handleData->savedOptions);
                                for (i = 0; i < vectorSize; i++)
                                {
                                    /*Codes_SRS_HTTPAPIEX_02_035: [HTTPAPIEX_ExecuteRequest shall pass all the saved options (see HTTPAPIEX_SetOption) to the newly create HTTPAPI_HANDLE in step 2 by calling HTTPAPI_SetOption.]*/
                                    /*Codes_SRS_HTTPAPIEX_02_036: [If setting the option fails, then the failure shall be ignored.] */
                                    HTTPAPIEX_SAVED_OPTION* option = (HTTPAPIEX_SAVED_OPTION*)VECTOR_element(handleData->savedOptions, i);
                                    if (HTTPAPI_SetOption(handleData->httpHandle, option->optionName, option->value) != HTTPAPI_OK)
                                    {
                                        LogError("HTTPAPI_SetOption failed when called for option %s", option->optionName);
                                    }
                                }
                                goOn = true;
                            }
                            break;
                        }
                        case 2:
                        {
                            size_t length = BUFFER_length(toBeUsedRequestContent);
                            unsigned char* buffer = BUFFER_u_char(toBeUsedRequestContent);
                            if (HTTPAPI_ExecuteRequest(handleData->httpHandle, requestType, toBeUsedRelativePath, toBeUsedRequestHttpHeadersHandle, buffer, length, toBeUsedStatusCode, toBeUsedResponseHttpHeadersHandle, toBeUsedResponseContent) != HTTPAPI_OK)
                            {
                                goOn = false;
                            }
                            else
                            {
                                goOn = true;
                            }
                            break;
                        }
                        default:
                        {
                            /*serious error*/
                            goOn = false;
                            break;
                        }
                        }
                    }

                    if (goOn)
                    {
                        if (handleData->k == 2)
                        {
                            /*Codes_SRS_HTTPAPIEX_02_028: [HTTPAPIEX_ExecuteRequest shall return HTTPAPIEX_OK when a call to HTTPAPI_ExecuteRequest has been completed successfully.]*/
                            result = HTTPAPIEX_OK;
                            goto out;
                        }
                        else
                        {
                            st[handleData->k] = true;
                            handleData->k++;
                            st[handleData->k] = false;
                        }
                    }
                    else
                    {
                        st[handleData->k] = false;
                        handleData->k--;
                        switch (handleData->k)
                        {
                        case 0:
                        {
                            /*Codes_SRS_HTTPAPIEX_21_049: [If HTTPAPIEX_Init was called, HTTPAPI_ExecuteRequest shall not call HTTPAPI_Deinit.] */
                            if (useGlobalInitialization == 0)
                            {
                                HTTPAPI_Deinit();
                            }
                            break;
                        }
                        case 1:
                        {
                            HTTPAPI_CloseConnection(handleData->httpHandle);
                            handleData->httpHandle = NULL;
                            break;
                        }
                        case 2:
                        {
                            break;
                        }
                        default:
                        {
                            break;
                        }
                        }
                    }
                } while (handleData->k >= 0);
                /*Codes_SRS_HTTPAPIEX_02_029: [Otherwise, HTTAPIEX_ExecuteRequest shall return HTTPAPIEX_RECOVERYFAILED.] */
                result = HTTPAPIEX_RECOVERYFAILED;
                LogError("unable to recover sending to a working state");
            out:;
                /*in all cases, unbuild the temporaries*/
                if (isOriginalRequestContent == false)
                {
                    BUFFER_delete(toBeUsedRequestContent);
                    toBeUsedRequestContent = NULL;
                }
                if (isOriginalRequestHttpHeadersHandle == false)
                {
                    HTTPHeaders_Free(toBeUsedRequestHttpHeadersHandle);
                    toBeUsedRequestHttpHeadersHandle = NULL;
                }
                if (isOriginalResponseContent == false)
                {
                    BUFFER_delete(toBeUsedResponseContent);
                    toBeUsedResponseContent = NULL;
                }
                if (isOriginalResponseHttpHeadersHandle == false)
                {
                    HTTPHeaders_Free(toBeUsedResponseHttpHeadersHandle);
                    toBeUsedResponseHttpHeadersHandle = NULL;
                }
            }
        }
    }
    return result;
}